

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O1

void rw::wdgl::skinUninstanceCB(Geometry *geo)

{
  AttribDesc *a;
  Skin *this;
  InstanceDataHeader *pIVar1;
  int iVar2;
  long lVar3;
  uint8 *src;
  uint8 *puVar4;
  float *pfVar5;
  float fVar6;
  
  this = *(Skin **)((long)geo->texCoords + (long)skinGlobals + -0x38);
  if (this == (Skin *)0x0) {
    return;
  }
  pIVar1 = geo->instData;
  puVar4 = this->data;
  pfVar5 = this->inverseMatrices;
  Skin::init(this,(EVP_PKEY_CTX *)(ulong)(uint)this->numBones);
  memcpy(this->inverseMatrices,pfVar5,(long)this->numBones << 6);
  (*DAT_00149da0)(puVar4);
  if (0 < (int)pIVar1[1].platform) {
    puVar4 = this->indices;
    pfVar5 = this->weights;
    lVar3 = 0;
    do {
      a = (AttribDesc *)(*(long *)(pIVar1 + 2) + lVar3 * 0x18);
      src = (uint8 *)((ulong)a->offset + *(long *)(pIVar1 + 6));
      if (a->index == 4) {
        if (0 < geo->numVertices) {
          iVar2 = 0;
          do {
            unpackattrib(pfVar5,src,a,1.0);
            fVar6 = *pfVar5 + pfVar5[1] + pfVar5[2] + pfVar5[3];
            if ((fVar6 != 0.0) || (NAN(fVar6))) {
              *pfVar5 = *pfVar5 / fVar6;
              pfVar5[1] = pfVar5[1] / fVar6;
              pfVar5[2] = pfVar5[2] / fVar6;
              pfVar5[3] = pfVar5[3] / fVar6;
            }
            pfVar5 = pfVar5 + 4;
            src = src + a->stride;
            iVar2 = iVar2 + 1;
          } while (iVar2 < geo->numVertices);
        }
      }
      else if ((a->index == 5) && (0 < geo->numVertices)) {
        iVar2 = 0;
        do {
          *puVar4 = *src;
          puVar4[1] = src[1];
          puVar4[2] = src[2];
          puVar4[3] = src[3];
          puVar4 = puVar4 + 4;
          src = src + a->stride;
          iVar2 = iVar2 + 1;
        } while (iVar2 < geo->numVertices);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)pIVar1[1].platform);
  }
  Skin::findNumWeights(this,geo->numVertices);
  Skin::findUsedBones(this,geo->numVertices);
  return;
}

Assistant:

void*
destroyNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_WDGL)
		return object;
	InstanceDataHeader *header =
		(InstanceDataHeader*)geometry->instData;
	geometry->instData = nil;
	// TODO: delete ibo and vbo
	rwFree(header->attribs);
	rwFree(header->data);
	rwFree(header);
	return object;
}